

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCore.c
# Opt level: O3

Aig_Man_t * Csw_Sweep(Aig_Man_t *pAig,int nCutsMax,int nLeafMax,int fVerbose)

{
  void *pvVar1;
  Aig_Man_t *pAVar2;
  int iVar3;
  Csw_Man_t *p;
  ulong uVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  long lVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  long lVar10;
  timespec ts;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  p = Csw_ManStart(pAig,nCutsMax,nLeafMax,fVerbose);
  pVVar5 = p->pManRes->vCis;
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    do {
      pAVar9 = (Aig_Obj_t *)pVVar5->pArray[lVar10];
      Csw_ObjPrepareCuts(p,pAVar9,1);
      pVVar5 = p->pManAig->vCis;
      if (pVVar5->nSize <= lVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      p->pnRefs[pAVar9->Id] =
           p->pnRefs[pAVar9->Id] + (*(uint *)((long)pVVar5->pArray[lVar10] + 0x18) >> 6);
      lVar10 = lVar10 + 1;
      pVVar5 = p->pManRes->vCis;
    } while (lVar10 < pVVar5->nSize);
  }
  pVVar5 = pAig->vObjs;
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar10];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_004efc18;
        uVar4 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar4 == 0) {
          pAVar9 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar9 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^
                   (ulong)p->pEquiv[*(int *)(uVar4 + 0x24)]);
        }
        uVar4 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar4 == 0) {
          pAVar8 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar8 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^
                   (ulong)p->pEquiv[*(int *)(uVar4 + 0x24)]);
        }
        pAVar9 = Aig_And(p->pManRes,pAVar9,pAVar8);
        do {
          pAVar8 = Csw_ObjSweep(p,(Aig_Obj_t *)((ulong)pAVar9 & 0xfffffffffffffffe),
                                (uint)((*(uint *)((long)pvVar1 + 0x18) & 0xffffff80) != 0));
          pAVar9 = (Aig_Obj_t *)((ulong)((uint)pAVar9 & 1) ^ (ulong)pAVar8);
          iVar3 = *(int *)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x24);
          if (p->pCuts[iVar3] != (Csw_Cut_t *)0x0) break;
        } while ((*(uint *)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18) & 7) != 1);
        p->pEquiv[*(int *)((long)pvVar1 + 0x24)] = pAVar9;
        p->pnRefs[iVar3] = p->pnRefs[iVar3] + (*(uint *)((long)pvVar1 + 0x18) >> 6);
        pVVar5 = pAig->vObjs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar5->nSize);
  }
  pVVar5 = pAig->vCos;
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    do {
      if (((ulong)pVVar5->pArray[lVar10] & 1) != 0) {
LAB_004efc18:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswInt.h"
                      ,0x74,"Aig_Obj_t *Csw_ObjChild0Equiv(Csw_Man_t *, Aig_Obj_t *)");
      }
      uVar4 = *(ulong *)((long)pVVar5->pArray[lVar10] + 8);
      uVar6 = uVar4 & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        pAVar9 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar9 = (Aig_Obj_t *)((ulong)((uint)uVar4 & 1) ^ (ulong)p->pEquiv[*(int *)(uVar6 + 0x24)]);
      }
      Aig_ObjCreateCo(p->pManRes,pAVar9);
      lVar10 = lVar10 + 1;
      pVVar5 = pAig->vCos;
    } while (lVar10 < pVVar5->nSize);
  }
  Aig_ManCleanup(p->pManRes);
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeTotal = lVar10 + lVar7;
  pAVar2 = p->pManRes;
  p->timeOther = (lVar10 + lVar7) - (p->timeCuts + p->timeHash);
  Csw_ManStop(p);
  return pAVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Csw_Sweep( Aig_Man_t * pAig, int nCutsMax, int nLeafMax, int fVerbose )
{
    Csw_Man_t * p;
    Aig_Man_t * pRes;
    Aig_Obj_t * pObj, * pObjNew, * pObjRes;
    int i;
    abctime clk;
clk = Abc_Clock();
    // start the manager
    p = Csw_ManStart( pAig, nCutsMax, nLeafMax, fVerbose );
    // set elementary cuts at the PIs
    Aig_ManForEachCi( p->pManRes, pObj, i )
    {
        Csw_ObjPrepareCuts( p, pObj, 1 );
        Csw_ObjAddRefs( p, pObj, Aig_ManCi(p->pManAig,i)->nRefs );
    }
    // process the nodes
    Aig_ManForEachNode( pAig, pObj, i )
    {
        // create the new node
        pObjNew = Aig_And( p->pManRes, Csw_ObjChild0Equiv(p, pObj), Csw_ObjChild1Equiv(p, pObj) );
        // check if this node can be represented using another node
//        pObjRes = Csw_ObjSweep( p, Aig_Regular(pObjNew), pObj->nRefs > 1 );
//        pObjRes = Aig_NotCond( pObjRes, Aig_IsComplement(pObjNew) );
        // try recursively if resubsitution is used
        do {
            pObjRes = Csw_ObjSweep( p, Aig_Regular(pObjNew), pObj->nRefs > 1 );
            pObjRes = Aig_NotCond( pObjRes, Aig_IsComplement(pObjNew) );        
            pObjNew = pObjRes;
        } while ( Csw_ObjCuts(p, Aig_Regular(pObjNew)) == NULL && !Aig_ObjIsConst1(Aig_Regular(pObjNew)) );
        // save the resulting node
        Csw_ObjSetEquiv( p, pObj, pObjRes );
        // add to the reference counter
        Csw_ObjAddRefs( p, Aig_Regular(pObjRes), pObj->nRefs );
    }
    // add the POs
    Aig_ManForEachCo( pAig, pObj, i )
        Aig_ObjCreateCo( p->pManRes, Csw_ObjChild0Equiv(p, pObj) );
    // remove dangling nodes 
    Aig_ManCleanup( p->pManRes );
    // return the resulting manager
p->timeTotal = Abc_Clock() - clk;
p->timeOther = p->timeTotal - p->timeCuts - p->timeHash;
    pRes = p->pManRes;
    Csw_ManStop( p );
    return pRes;
}